

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O3

SubTypeAccess * __thiscall
glu::SubTypeAccess::element(SubTypeAccess *__return_storage_ptr__,SubTypeAccess *this,int ndx)

{
  VarType VStack_58;
  vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> local_40;
  VarTypeComponent local_28;
  
  VarType::VarType(&VStack_58,&this->m_type);
  std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::vector
            (&local_40,&this->m_path);
  local_28.type = ARRAY_ELEMENT;
  local_28.index = ndx;
  std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
  emplace_back<glu::VarTypeComponent>(&local_40,&local_28);
  VarType::VarType(&__return_storage_ptr__->m_type,&VStack_58);
  std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::vector
            (&__return_storage_ptr__->m_path,&local_40);
  if (local_40.super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  VarType::~VarType(&VStack_58);
  return __return_storage_ptr__;
}

Assistant:

SubTypeAccess				element				(int ndx) const { return SubTypeAccess(*this).element(ndx);		}